

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O1

REF_STATUS ref_validation_repair(REF_GRID ref_grid)

{
  int *piVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  REF_NODE pRVar5;
  REF_CELL pRVar6;
  REF_INT *pRVar7;
  REF_INT *pRVar8;
  REF_DBL *pRVar9;
  REF_INT RVar10;
  uint uVar11;
  uint uVar12;
  REF_STATUS RVar13;
  void *__ptr;
  long lVar14;
  REF_CELL *ppRVar15;
  ulong uVar16;
  undefined8 uVar17;
  long lVar18;
  REF_FACE pRVar19;
  int iVar20;
  ulong uVar21;
  char *pcVar22;
  REF_GRID pRVar23;
  long lVar24;
  REF_STATUS ref_private_macro_code_rss;
  bool bVar25;
  double dVar26;
  double dVar27;
  REF_INT cell0;
  uint local_1ac;
  REF_INT face_nodes [4];
  REF_INT new_node;
  REF_INT nodes [4];
  REF_FACE ref_face;
  REF_INT new_cell;
  ulong local_160;
  REF_GRID local_158;
  REF_INT cell1;
  REF_CELL *local_148;
  REF_NODE local_140;
  REF_BOOL split_face;
  REF_CELL *local_130;
  long local_128;
  REF_GLOB global;
  REF_INT tri_face;
  REF_INT local_114;
  REF_INT local_110;
  REF_INT local_10c;
  REF_INT local_108;
  REF_INT hex_nodes [27];
  
  pRVar5 = ref_grid->node;
  uVar11 = ref_face_create(&ref_face,ref_grid);
  pRVar19 = ref_face;
  uVar21 = (ulong)uVar11;
  if (uVar11 == 0) {
    local_140 = pRVar5;
    if ((long)ref_face->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x229,"ref_validation_repair","malloc hits of REF_INT negative");
      return 1;
    }
    __ptr = malloc((long)ref_face->n << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x229,"ref_validation_repair","malloc hits of REF_INT NULL");
      return 2;
    }
    local_1ac = 0;
    if (0 < pRVar19->n) {
      lVar14 = 0;
      do {
        *(undefined4 *)((long)__ptr + lVar14 * 4) = 0;
        lVar14 = lVar14 + 1;
        local_1ac = (uint)lVar14;
      } while (lVar14 < pRVar19->n);
    }
    local_130 = ref_grid->cell;
    ppRVar15 = ref_grid->cell + 8;
    lVar14 = 8;
    local_158 = ref_grid;
    local_148 = ppRVar15;
    do {
      local_160 = CONCAT44(local_160._4_4_,(int)uVar21);
      pRVar6 = *ppRVar15;
      local_128 = lVar14;
      if (0 < pRVar6->max) {
        iVar20 = 0;
        do {
          if ((pRVar6->c2n[(long)pRVar6->size_per * (long)iVar20] != -1) && (0 < pRVar6->face_per))
          {
            lVar14 = 0;
            lVar24 = 0;
            do {
              pRVar7 = pRVar6->c2n;
              pRVar8 = pRVar6->f2n;
              lVar18 = 0;
              do {
                nodes[lVar18] =
                     pRVar7[(long)pRVar6->size_per * (long)iVar20 +
                            (long)*(int *)((long)pRVar8 + lVar18 * 4 + lVar14)];
                lVar18 = lVar18 + 1;
              } while (lVar18 != 4);
              uVar11 = ref_face_with(ref_face,nodes,(REF_INT *)&local_1ac);
              if (uVar11 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x233,"ref_validation_repair",(ulong)uVar11,"find cell face");
                return uVar11;
              }
              piVar1 = (int *)((long)__ptr + (long)(int)local_1ac * 4);
              *piVar1 = *piVar1 + 1;
              lVar24 = lVar24 + 1;
              lVar14 = lVar14 + 0x10;
            } while (lVar24 < pRVar6->face_per);
          }
          iVar20 = iVar20 + 1;
        } while (iVar20 < pRVar6->max);
      }
      ppRVar15 = local_130 + local_128 + 1;
      lVar14 = local_128 + 1;
      uVar21 = local_160 & 0xffffffff;
    } while (lVar14 != 0x10);
    pRVar6 = local_158->cell[3];
    if (0 < pRVar6->max) {
      iVar20 = 0;
      do {
        pRVar7 = pRVar6->c2n;
        if (pRVar7[(long)pRVar6->size_per * (long)iVar20] != -1) {
          lVar14 = 0;
          do {
            nodes[lVar14] = pRVar7[(long)pRVar6->size_per * (long)iVar20 + lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          nodes[3] = nodes[0];
          uVar11 = ref_face_with(ref_face,nodes,(REF_INT *)&local_1ac);
          pRVar23 = local_158;
          if (uVar11 != 0) {
            ref_node_location(local_158->node,nodes[0]);
            ref_node_location(pRVar23->node,nodes[1]);
            ref_node_location(pRVar23->node,nodes[2]);
            ref_node_location(pRVar23->node,nodes[3]);
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x246,"ref_validation_repair",(ulong)uVar11,"find tri");
            uVar21 = (ulong)uVar11;
          }
          if (uVar11 != 0) {
            return (REF_STATUS)uVar21;
          }
          piVar1 = (int *)((long)__ptr + (long)(int)local_1ac * 4);
          *piVar1 = *piVar1 + 1;
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 < pRVar6->max);
    }
    pRVar6 = local_158->cell[6];
    if (0 < pRVar6->max) {
      iVar20 = 0;
      do {
        pRVar7 = pRVar6->c2n;
        if (pRVar7[(long)pRVar6->size_per * (long)iVar20] != -1) {
          lVar14 = 0;
          do {
            nodes[lVar14] = pRVar7[(long)pRVar6->size_per * (long)iVar20 + lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          uVar11 = ref_face_with(ref_face,nodes,(REF_INT *)&local_1ac);
          if (uVar11 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x24f,"ref_validation_repair",(ulong)uVar11,"find qua");
            uVar21 = (ulong)uVar11;
          }
          if (uVar11 != 0) {
            return (REF_STATUS)uVar21;
          }
          piVar1 = (int *)((long)__ptr + (long)(int)local_1ac * 4);
          *piVar1 = *piVar1 + 1;
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 < pRVar6->max);
    }
    local_1ac = 0;
    pRVar19 = ref_face;
    pRVar23 = local_158;
    if (0 < ref_face->n) {
      do {
        iVar20 = *(int *)((long)__ptr + (long)(int)local_1ac * 4);
        if (pRVar23->mpi->n < 2) {
          bVar25 = iVar20 != 2;
LAB_00200f13:
          if (bVar25) goto LAB_00200f1b;
        }
        else {
          pRVar7 = local_140->part;
          iVar4 = local_140->ref_mpi->id;
          pRVar8 = ref_face->f2n;
          uVar11 = local_1ac << 2;
          if (((iVar4 != pRVar7[pRVar8[(int)uVar11]]) &&
              (iVar4 != pRVar7[pRVar8[(int)(uVar11 | 1)]])) &&
             (iVar4 != pRVar7[pRVar8[(int)(uVar11 | 2)]])) {
            bVar25 = iVar4 == pRVar7[pRVar8[(int)(uVar11 | 3)]] || 2 < iVar20;
            if ((iVar4 == pRVar7[pRVar8[(int)(uVar11 | 3)]]) && (iVar20 < 3)) goto LAB_00200f05;
            goto LAB_00200f13;
          }
          if (iVar20 < 3) {
LAB_00200f05:
            bVar25 = iVar20 < 2;
            goto LAB_00200f13;
          }
LAB_00200f1b:
          printf(" hits %d\n",(ulong)*(uint *)((long)__ptr + (long)(int)local_1ac * 4));
          pRVar7 = ref_face->f2n;
          lVar14 = 0;
          do {
            nodes[lVar14] = pRVar7[(long)(int)local_1ac * 4 + lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          printf("face %d nodes %d %d %d %d global %ld %ld %ld %ld\n",(ulong)local_1ac);
          uVar11 = ref_node_location(pRVar23->node,nodes[0]);
          if (uVar11 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x26c,"ref_validation_repair",(ulong)uVar11,"n0");
            uVar21 = (ulong)uVar11;
          }
          if (uVar11 != 0) {
            return (REF_STATUS)uVar21;
          }
          uVar11 = ref_node_location(pRVar23->node,nodes[1]);
          if (uVar11 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x26d,"ref_validation_repair",(ulong)uVar11,"n1");
            uVar21 = (ulong)uVar11;
          }
          if (uVar11 != 0) {
            return (REF_STATUS)uVar21;
          }
          uVar11 = ref_node_location(pRVar23->node,nodes[2]);
          if (uVar11 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x26e,"ref_validation_repair",(ulong)uVar11,"n2");
            uVar21 = (ulong)uVar11;
          }
          if (uVar11 != 0) {
            return (REF_STATUS)uVar21;
          }
          uVar11 = ref_node_location(pRVar23->node,nodes[3]);
          if (uVar11 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x26f,"ref_validation_repair",(ulong)uVar11,"n3");
            uVar21 = (ulong)uVar11;
          }
          if (uVar11 != 0) {
            return (REF_STATUS)uVar21;
          }
          if (nodes[0] != nodes[3]) {
            pRVar6 = pRVar23->cell[0xb];
            puts("have quad");
            uVar11 = ref_cell_with_face(pRVar6,nodes,&cell0,&cell1);
            if (uVar11 == 0) {
              printf("hexes %d %d\n",(ulong)(uint)cell0,(ulong)(uint)cell1);
              RVar10 = cell1;
              if (cell0 == -1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x279,"ref_validation_repair","cant find hex");
                uVar21 = 1;
              }
              else {
                if ((long)cell1 != -1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                         ,0x27a,"ref_validation_repair","found 2 hex",0xffffffffffffffff,(long)cell1
                        );
                  uVar21 = 1;
                }
                if (RVar10 == -1) {
                  uVar11 = ref_cell_nodes(pRVar6,cell0,hex_nodes);
                  if (uVar11 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                           ,0x27b,"ref_validation_repair",(ulong)uVar11,"hex");
                    uVar21 = (ulong)uVar11;
                  }
                  if (uVar11 == 0) {
                    uVar12 = ref_node_next_global(local_140,&global);
                    uVar11 = (uint)uVar21;
                    if (uVar12 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                             ,0x27c,"ref_validation_repair",(ulong)uVar12,"next global");
                      uVar11 = uVar12;
                    }
                    uVar21 = (ulong)uVar11;
                    if (uVar12 == 0) {
                      uVar11 = ref_node_add(local_140,global,&new_node);
                      if (uVar11 == 0) {
                        pRVar9 = local_140->real;
                        lVar14 = (long)new_node;
                        pdVar2 = pRVar9 + lVar14 * 0xf;
                        pRVar9[lVar14 * 0xf] = 0.0;
                        (pRVar9 + lVar14 * 0xf)[1] = 0.0;
                        pRVar9[lVar14 * 0xf + 2] = 0.0;
                        iVar20 = pRVar6->node_per;
                        if (0 < (long)iVar20) {
                          dVar3 = *pdVar2;
                          dVar26 = pdVar2[1];
                          dVar27 = pdVar2[2];
                          lVar14 = 0;
                          do {
                            lVar24 = (long)hex_nodes[lVar14];
                            dVar3 = dVar3 + pRVar9[lVar24 * 0xf];
                            *pdVar2 = dVar3;
                            dVar26 = dVar26 + pRVar9[lVar24 * 0xf + 1];
                            pdVar2[1] = dVar26;
                            dVar27 = dVar27 + pRVar9[lVar24 * 0xf + 2];
                            pdVar2[2] = dVar27;
                            lVar14 = lVar14 + 1;
                          } while (iVar20 != lVar14);
                        }
                        dVar3 = (double)iVar20;
                        *pdVar2 = *pdVar2 / dVar3;
                        pdVar2[1] = pdVar2[1] / dVar3;
                        pdVar2[2] = pdVar2[2] / dVar3;
                        if (0 < pRVar6->face_per) {
                          lVar14 = 0;
                          uVar16 = 0;
                          do {
                            pRVar7 = pRVar6->f2n;
                            pRVar8 = pRVar6->c2n;
                            lVar24 = (long)pRVar6->size_per * (long)cell0;
                            face_nodes[0] = pRVar8[*(int *)((long)pRVar7 + lVar14) + lVar24];
                            lVar24 = (long)(int)lVar24;
                            face_nodes[1] = pRVar8[*(int *)((long)pRVar7 + lVar14 + 4) + lVar24];
                            face_nodes[2] = pRVar8[*(int *)((long)pRVar7 + lVar14 + 8) + lVar24];
                            face_nodes[3] =
                                 pRVar8[(long)pRVar6->size_per * (long)cell0 +
                                        (long)*(int *)((long)pRVar7 + lVar14 + 0xc)];
                            local_160 = uVar16;
                            uVar11 = ref_sort_same(4,nodes,face_nodes,&split_face);
                            if (uVar11 == 0) {
                              if (split_face == 0) {
                                pRVar7 = pRVar6->f2n;
                                pRVar8 = pRVar6->c2n;
                                lVar18 = (long)cell0;
                                lVar24 = pRVar6->size_per * lVar18;
                                tri_face = pRVar8[*(int *)((long)pRVar7 + lVar14) + lVar24];
                                local_10c = pRVar8[(long)(int)lVar24 +
                                                   (long)*(int *)((long)pRVar7 + lVar14 + 4)];
                                local_108 = pRVar8[pRVar6->size_per * lVar18 +
                                                   (long)*(int *)((long)pRVar7 + lVar14 + 8)];
                                local_114 = pRVar8[pRVar6->size_per * lVar18 +
                                                   (long)*(int *)((long)pRVar7 + lVar14 + 0xc)];
                                local_110 = new_node;
                                uVar11 = ref_cell_add(local_158->cell[9],&tri_face,&new_cell);
                                if (uVar11 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                                         ,0x2c7,"ref_validation_repair",(ulong)uVar11,"pyr");
                                  uVar21 = (ulong)uVar11;
                                  goto LAB_002014da;
                                }
                              }
                              else {
                                pRVar7 = pRVar6->f2n;
                                pRVar8 = pRVar6->c2n;
                                lVar24 = (long)cell0 * (long)pRVar6->size_per;
                                face_nodes[0] = pRVar8[*(int *)((long)pRVar7 + lVar14) + lVar24];
                                lVar24 = (long)(int)lVar24;
                                face_nodes[1] = pRVar8[*(int *)((long)pRVar7 + lVar14 + 4) + lVar24]
                                ;
                                face_nodes[2] = pRVar8[*(int *)((long)pRVar7 + lVar14 + 8) + lVar24]
                                ;
                                face_nodes[3] = face_nodes[0];
                                RVar13 = ref_face_with(ref_face,face_nodes,&tri_face);
                                if (RVar13 == 0) {
                                  pRVar7 = pRVar6->f2n;
                                  pRVar8 = pRVar6->c2n;
                                  lVar24 = (long)cell0 * (long)pRVar6->size_per;
                                  face_nodes[0] = pRVar8[*(int *)((long)pRVar7 + lVar14) + lVar24];
                                  lVar24 = (long)(int)lVar24;
                                  face_nodes[1] =
                                       pRVar8[*(int *)((long)pRVar7 + lVar14 + 4) + lVar24];
                                  face_nodes[2] =
                                       pRVar8[*(int *)((long)pRVar7 + lVar14 + 8) + lVar24];
                                  face_nodes[3] = new_node;
                                  uVar11 = ref_cell_add(*local_148,face_nodes,&new_cell);
                                  if (uVar11 == 0) {
                                    pRVar7 = pRVar6->f2n;
                                    pRVar8 = pRVar6->c2n;
                                    lVar24 = (long)cell0 * (long)pRVar6->size_per;
                                    face_nodes[0] = pRVar8[*(int *)((long)pRVar7 + lVar14) + lVar24]
                                    ;
                                    lVar24 = (long)(int)lVar24;
                                    face_nodes[1] =
                                         pRVar8[*(int *)((long)pRVar7 + lVar14 + 8) + lVar24];
                                    face_nodes[2] =
                                         pRVar8[*(int *)((long)pRVar7 + lVar14 + 0xc) + lVar24];
                                    face_nodes[3] = new_node;
                                    uVar11 = ref_cell_add(*local_148,face_nodes,&new_cell);
                                    if (uVar11 == 0) goto LAB_0020157b;
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                                           ,0x2ab,"ref_validation_repair",(ulong)uVar11,"tet");
                                    uVar21 = (ulong)uVar11;
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                                           ,0x2a5,"ref_validation_repair",(ulong)uVar11,"tet");
                                    uVar21 = (ulong)uVar11;
                                  }
LAB_00201939:
                                  bVar25 = false;
                                }
                                else {
LAB_0020157b:
                                  pRVar7 = pRVar6->f2n;
                                  pRVar8 = pRVar6->c2n;
                                  lVar24 = (long)cell0 * (long)pRVar6->size_per;
                                  face_nodes[0] = pRVar8[*(int *)((long)pRVar7 + lVar14) + lVar24];
                                  lVar24 = (long)(int)lVar24;
                                  face_nodes[1] =
                                       pRVar8[*(int *)((long)pRVar7 + lVar14 + 4) + lVar24];
                                  face_nodes[2] =
                                       pRVar8[*(int *)((long)pRVar7 + lVar14 + 0xc) + lVar24];
                                  face_nodes[3] = face_nodes[0];
                                  RVar13 = ref_face_with(ref_face,face_nodes,&tri_face);
                                  bVar25 = true;
                                  if (RVar13 == 0) {
                                    pRVar7 = pRVar6->f2n;
                                    pRVar8 = pRVar6->c2n;
                                    lVar24 = (long)cell0 * (long)pRVar6->size_per;
                                    face_nodes[0] = pRVar8[*(int *)((long)pRVar7 + lVar14) + lVar24]
                                    ;
                                    lVar24 = (long)(int)lVar24;
                                    face_nodes[1] =
                                         pRVar8[*(int *)((long)pRVar7 + lVar14 + 4) + lVar24];
                                    face_nodes[2] =
                                         pRVar8[*(int *)((long)pRVar7 + lVar14 + 0xc) + lVar24];
                                    face_nodes[3] = new_node;
                                    uVar11 = ref_cell_add(*local_148,face_nodes,&new_cell);
                                    if (uVar11 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                                             ,0x2b7,"ref_validation_repair",(ulong)uVar11,"tet");
                                      uVar21 = (ulong)uVar11;
                                      goto LAB_00201939;
                                    }
                                    pRVar7 = pRVar6->f2n;
                                    pRVar8 = pRVar6->c2n;
                                    lVar24 = (long)cell0 * (long)pRVar6->size_per;
                                    face_nodes[0] =
                                         pRVar8[*(int *)((long)pRVar7 + lVar14 + 4) + lVar24];
                                    lVar24 = (long)(int)lVar24;
                                    face_nodes[1] =
                                         pRVar8[*(int *)((long)pRVar7 + lVar14 + 8) + lVar24];
                                    face_nodes[2] =
                                         pRVar8[*(int *)((long)pRVar7 + lVar14 + 0xc) + lVar24];
                                    face_nodes[3] = new_node;
                                    uVar11 = ref_cell_add(*local_148,face_nodes,&new_cell);
                                    bVar25 = uVar11 == 0;
                                    if (!bVar25) {
                                      uVar21 = (ulong)uVar11;
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                                             ,0x2bd,"ref_validation_repair",(ulong)uVar11,"tet");
                                    }
                                  }
                                }
                                if (!bVar25) goto LAB_002014da;
                              }
                              bVar25 = true;
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                                     ,0x298,"ref_validation_repair",(ulong)uVar11,"same");
                              uVar21 = (ulong)uVar11;
LAB_002014da:
                              bVar25 = false;
                            }
                            if (!bVar25) goto LAB_002012a9;
                            uVar16 = local_160 + 1;
                            lVar14 = lVar14 + 0x10;
                          } while ((long)uVar16 < (long)pRVar6->face_per);
                        }
                        uVar11 = ref_cell_remove(local_158->cell[0xb],cell0);
                        bVar25 = uVar11 == 0;
                        if (!bVar25) {
                          bVar25 = false;
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                                 ,0x2ca,"ref_validation_repair",(ulong)uVar11,"hex");
                          uVar21 = (ulong)uVar11;
                        }
                        goto LAB_002012ae;
                      }
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                             ,0x27d,"ref_validation_repair",(ulong)uVar11,"new node");
                      uVar21 = (ulong)uVar11;
                    }
                  }
                }
              }
LAB_002012a9:
              bVar25 = false;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x277,"ref_validation_repair",(ulong)uVar11,"hex");
              uVar21 = (ulong)uVar11;
              bVar25 = false;
            }
LAB_002012ae:
            pRVar23 = local_158;
            if (!bVar25) {
              return (REF_STATUS)uVar21;
            }
          }
        }
        local_1ac = local_1ac + 1;
        pRVar19 = ref_face;
      } while ((int)local_1ac < ref_face->n);
    }
    free(__ptr);
    uVar11 = ref_face_free(pRVar19);
    if (uVar11 == 0) {
      return 0;
    }
    uVar21 = (ulong)uVar11;
    pcVar22 = "face free";
    uVar17 = 0x2d1;
  }
  else {
    pcVar22 = "face";
    uVar17 = 0x227;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
         uVar17,"ref_validation_repair",uVar21,pcVar22);
  return (REF_STATUS)uVar21;
}

Assistant:

REF_FCN REF_STATUS ref_validation_repair(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_FACE ref_face;
  REF_CELL ref_cell;
  REF_INT *hits;
  REF_INT face;
  REF_INT group, cell, cell_face;
  REF_INT node;
  REF_INT nodes[4];
  REF_BOOL report;
  REF_STATUS code;

  RSS(ref_face_create(&ref_face, ref_grid), "face");

  ref_malloc(hits, ref_face_n(ref_face), REF_INT);

  for (face = 0; face < ref_face_n(ref_face); face++) hits[face] = 0;

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      each_ref_cell_cell_face(ref_cell, cell_face) {
        for (node = 0; node < 4; node++) {
          nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        }
        RSS(ref_face_with(ref_face, nodes, &face), "find cell face");
        hits[face]++;
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 3; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    nodes[3] = nodes[0];
    code = ref_face_with(ref_face, nodes, &face);
    if (REF_SUCCESS != code) {
      ref_node_location(ref_grid_node(ref_grid), nodes[0]);
      ref_node_location(ref_grid_node(ref_grid), nodes[1]);
      ref_node_location(ref_grid_node(ref_grid), nodes[2]);
      ref_node_location(ref_grid_node(ref_grid), nodes[3]);
    }
    RSS(code, "find tri");
    hits[face]++;
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 4; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    RSS(ref_face_with(ref_face, nodes, &face), "find qua");
    hits[face]++;
  }

  for (face = 0; face < ref_face_n(ref_face); face++) {
    report = REF_FALSE;
    if (ref_mpi_para(ref_grid_mpi(ref_grid))) {
      report = report || (2 < hits[face]);
      if (ref_node_owned(ref_node, ref_face_f2n(ref_face, 0, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 1, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 2, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 3, face))) {
        report = report || (2 > hits[face]);
      }
    } else {
      report = report || (2 != hits[face]);
    }
    if (report) {
      printf(" hits %d\n", hits[face]);
      for (node = 0; node < 4; node++) {
        nodes[node] = ref_face_f2n(ref_face, node, face);
      }
      printf("face %d nodes %d %d %d %d global " REF_GLOB_FMT " " REF_GLOB_FMT
             " " REF_GLOB_FMT " " REF_GLOB_FMT "\n",
             face, nodes[0], nodes[1], nodes[2], nodes[3],
             ref_node_global(ref_grid_node(ref_grid), nodes[0]),
             ref_node_global(ref_grid_node(ref_grid), nodes[1]),
             ref_node_global(ref_grid_node(ref_grid), nodes[2]),
             ref_node_global(ref_grid_node(ref_grid), nodes[3]));
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[0]), "n0");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[1]), "n1");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[2]), "n2");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[3]), "n3");
      if (nodes[0] != nodes[3]) {
        REF_INT cell0, cell1;
        REF_INT hex_nodes[REF_CELL_MAX_SIZE_PER];
        REF_GLOB global;
        REF_INT new_node, cell_node;
        ref_cell = ref_grid_hex(ref_grid);
        printf("have quad\n");
        RSS(ref_cell_with_face(ref_cell, nodes, &cell0, &cell1), "hex");
        printf("hexes %d %d\n", cell0, cell1);
        RUS(REF_EMPTY, cell0, "cant find hex");
        REIS(REF_EMPTY, cell1, "found 2 hex");
        RSS(ref_cell_nodes(ref_cell, cell0, hex_nodes), "hex");
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &new_node), "new node");
        ref_node_xyz(ref_node, 0, new_node) = 0.0;
        ref_node_xyz(ref_node, 1, new_node) = 0.0;
        ref_node_xyz(ref_node, 2, new_node) = 0.0;
        each_ref_cell_cell_node(ref_cell, cell_node) {
          ref_node_xyz(ref_node, 0, new_node) +=
              ref_node_xyz(ref_node, 0, hex_nodes[cell_node]);
          ref_node_xyz(ref_node, 1, new_node) +=
              ref_node_xyz(ref_node, 1, hex_nodes[cell_node]);
          ref_node_xyz(ref_node, 2, new_node) +=
              ref_node_xyz(ref_node, 2, hex_nodes[cell_node]);
        }
        ref_node_xyz(ref_node, 0, new_node) /=
            (REF_DBL)ref_cell_node_per(ref_cell);
        ref_node_xyz(ref_node, 1, new_node) /=
            (REF_DBL)ref_cell_node_per(ref_cell);
        ref_node_xyz(ref_node, 2, new_node) /=
            (REF_DBL)ref_cell_node_per(ref_cell);
        each_ref_cell_cell_face(ref_cell, cell_face) {
          REF_INT face_nodes[4];
          REF_BOOL split_face;
          REF_INT new_cell;

          face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
          face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
          face_nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
          face_nodes[3] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
          RSS(ref_sort_same(4, nodes, face_nodes, &split_face), "same");
          if (split_face) {
            REF_INT tri_face;
            face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
            face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
            face_nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
            face_nodes[3] = face_nodes[0];
            if (REF_SUCCESS == ref_face_with(ref_face, face_nodes, &tri_face)) {
              face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
              face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
            }
            face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
            face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
            face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
            face_nodes[3] = face_nodes[0];
            if (REF_SUCCESS == ref_face_with(ref_face, face_nodes, &tri_face)) {
              face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
              face_nodes[0] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
            }
          } else {
            REF_INT pyr_nodes[REF_CELL_MAX_SIZE_PER];
            pyr_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
            pyr_nodes[3] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
            pyr_nodes[4] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
            pyr_nodes[1] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
            pyr_nodes[2] = new_node;
            RSS(ref_cell_add(ref_grid_pyr(ref_grid), pyr_nodes, &new_cell),
                "pyr");
          }
        }
        RSS(ref_cell_remove(ref_grid_hex(ref_grid), cell0), "hex");
      }
    }
  }

  free(hits);

  RSS(ref_face_free(ref_face), "face free");

  return REF_SUCCESS;
}